

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::removeDependency(TimeCoordinator *this,GlobalFederateId fedID)

{
  bool bVar1;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  __position;
  iterator this_00;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *this_01;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  res;
  handle dlock;
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  *in_stack_ffffffffffffff48;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  *in_stack_ffffffffffffff50;
  GlobalFederateId *in_stack_ffffffffffffff58;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  in_stack_ffffffffffffff68;
  TimeDependencies *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  local_30 [2];
  
  TimeDependencies::removeDependency
            (in_stack_ffffffffffffff88,
             (GlobalFederateId)(BaseType)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  gmlc::libguarded::
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::lock(in_stack_ffffffffffffff48);
  gmlc::libguarded::
  lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::begin((lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
           *)in_stack_ffffffffffffff48);
  gmlc::libguarded::
  lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::end((lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
         *)in_stack_ffffffffffffff48);
  __position = std::
               find<__gnu_cxx::__normal_iterator<helics::GlobalFederateId*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>,helics::GlobalFederateId>
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58);
  this_00 = gmlc::libguarded::
            lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
            ::end((lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
                   *)in_stack_ffffffffffffff48);
  bVar1 = __gnu_cxx::
          operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                    (in_stack_ffffffffffffff50,
                     (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                      *)in_stack_ffffffffffffff48);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_01 = gmlc::libguarded::
              lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
              ::operator->(local_30);
    __gnu_cxx::
    __normal_iterator<helics::GlobalFederateId_const*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>
    ::__normal_iterator<helics::GlobalFederateId*>
              ((__normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                *)this_01,
               (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                *)in_stack_ffffffffffffff48);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::erase
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               this_00._M_current,(const_iterator)__position._M_current);
  }
  gmlc::libguarded::
  lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::~lock_handle((lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
                  *)0x61a38b);
  return;
}

Assistant:

void TimeCoordinator::removeDependency(GlobalFederateId fedID)
{
    dependencies.removeDependency(fedID);
    // remove the thread safe version
    auto dlock = dependency_federates.lock();
    auto res = std::find(dlock.begin(), dlock.end(), fedID);
    if (res != dlock.end()) {
        dlock->erase(res);
    }
}